

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c++
# Opt level: O0

ArrayPtr<void_*const> __thiscall kj::getAsyncTrace(kj *this,ArrayPtr<void_*> space)

{
  ArrayPtr<void_*> space_00;
  long *in_FS_OFFSET;
  ArrayPtr<void_*> local_68;
  kj *local_58;
  void **local_50;
  undefined1 local_48 [8];
  TraceBuilder builder;
  EventLoop *loop;
  ArrayPtr<void_*> space_local;
  
  local_50 = space.ptr;
  builder.limit = *(void ***)(*in_FS_OFFSET + -0x20);
  space_local.ptr = local_50;
  if (builder.limit == (void **)0x0) {
    ArrayPtr<void_*const>::ArrayPtr((ArrayPtr<void_*const> *)&space_local.size_,(void *)0x0);
  }
  else if (builder.limit[0xe] == (void *)0x0) {
    ArrayPtr<void_*const>::ArrayPtr((ArrayPtr<void_*const> *)&space_local.size_,(void *)0x0);
  }
  else {
    space_00.size_ = (size_t)local_50;
    space_00.ptr = (void **)this;
    local_58 = this;
    _::TraceBuilder::TraceBuilder((TraceBuilder *)local_48,space_00);
    (*(code *)**builder.limit[0xe])(builder.limit[0xe],local_48);
    local_68 = _::TraceBuilder::finish((TraceBuilder *)local_48);
    join_0x00000010_0x00000000_ = ArrayPtr::operator_cast_to_ArrayPtr((ArrayPtr *)&local_68);
  }
  return stack0xffffffffffffffe8;
}

Assistant:

ArrayPtr<void* const> getAsyncTrace(ArrayPtr<void*> space) {
  EventLoop* loop = threadLocalEventLoop;
  if (loop == nullptr) return nullptr;
  if (loop->currentlyFiring == nullptr) return nullptr;

  _::TraceBuilder builder(space);
  loop->currentlyFiring->traceEvent(builder);
  return builder.finish();
}